

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O3

int QuantizeBlockWHT_SSE2(int16_t *in,int16_t *out,VP8Matrix *mtx)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  unkbyte10 Var9;
  unkbyte10 Var10;
  int iVar11;
  int iVar12;
  short sVar13;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  undefined1 auVar14 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int iVar27;
  short sVar35;
  undefined1 auVar29 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int iVar36;
  short sVar40;
  undefined1 auVar38 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar28 [12];
  undefined1 auVar30 [16];
  undefined1 auVar37 [12];
  undefined1 auVar39 [16];
  
  auVar14 = *(undefined1 (*) [16])in;
  auVar22 = *(undefined1 (*) [16])(in + 8);
  auVar24 = *(undefined1 (*) [16])mtx->iq_;
  auVar32 = *(undefined1 (*) [16])(mtx->iq_ + 8);
  sVar13 = auVar14._0_2_;
  sVar35 = -sVar13;
  sVar15 = auVar14._2_2_;
  sVar40 = -sVar15;
  sVar16 = auVar14._4_2_;
  sVar1 = -sVar16;
  sVar17 = auVar14._6_2_;
  sVar2 = -sVar17;
  sVar18 = auVar14._8_2_;
  sVar3 = -sVar18;
  sVar19 = auVar14._10_2_;
  sVar4 = -sVar19;
  sVar20 = auVar14._12_2_;
  sVar5 = -sVar20;
  sVar21 = auVar14._14_2_;
  sVar6 = -sVar21;
  auVar29._0_2_ = (ushort)(sVar35 < sVar13) * sVar13 | (ushort)(sVar35 >= sVar13) * sVar35;
  auVar29._2_2_ = (ushort)(sVar40 < sVar15) * sVar15 | (ushort)(sVar40 >= sVar15) * sVar40;
  auVar29._4_2_ = (ushort)(sVar1 < sVar16) * sVar16 | (ushort)(sVar1 >= sVar16) * sVar1;
  auVar29._6_2_ = (ushort)(sVar2 < sVar17) * sVar17 | (ushort)(sVar2 >= sVar17) * sVar2;
  auVar29._8_2_ = (ushort)(sVar3 < sVar18) * sVar18 | (ushort)(sVar3 >= sVar18) * sVar3;
  auVar29._10_2_ = (ushort)(sVar4 < sVar19) * sVar19 | (ushort)(sVar4 >= sVar19) * sVar4;
  auVar29._12_2_ = (ushort)(sVar5 < sVar20) * sVar20 | (ushort)(sVar5 >= sVar20) * sVar5;
  auVar29._14_2_ = (ushort)(sVar6 < sVar21) * sVar21 | (ushort)(sVar6 >= sVar21) * sVar6;
  auVar14 = psraw(auVar14,0xf);
  sVar13 = auVar22._0_2_;
  sVar35 = -sVar13;
  sVar15 = auVar22._2_2_;
  sVar40 = -sVar15;
  sVar16 = auVar22._4_2_;
  sVar1 = -sVar16;
  sVar17 = auVar22._6_2_;
  sVar2 = -sVar17;
  sVar18 = auVar22._8_2_;
  sVar3 = -sVar18;
  sVar19 = auVar22._10_2_;
  sVar4 = -sVar19;
  sVar20 = auVar22._12_2_;
  sVar5 = -sVar20;
  sVar21 = auVar22._14_2_;
  sVar6 = -sVar21;
  auVar38._0_2_ = (ushort)(sVar35 < sVar13) * sVar13 | (ushort)(sVar35 >= sVar13) * sVar35;
  auVar38._2_2_ = (ushort)(sVar40 < sVar15) * sVar15 | (ushort)(sVar40 >= sVar15) * sVar40;
  auVar38._4_2_ = (ushort)(sVar1 < sVar16) * sVar16 | (ushort)(sVar1 >= sVar16) * sVar1;
  auVar38._6_2_ = (ushort)(sVar2 < sVar17) * sVar17 | (ushort)(sVar2 >= sVar17) * sVar2;
  auVar38._8_2_ = (ushort)(sVar3 < sVar18) * sVar18 | (ushort)(sVar3 >= sVar18) * sVar3;
  auVar38._10_2_ = (ushort)(sVar4 < sVar19) * sVar19 | (ushort)(sVar4 >= sVar19) * sVar4;
  auVar38._12_2_ = (ushort)(sVar5 < sVar20) * sVar20 | (ushort)(sVar5 >= sVar20) * sVar5;
  auVar38._14_2_ = (ushort)(sVar6 < sVar21) * sVar21 | (ushort)(sVar6 >= sVar21) * sVar6;
  auVar22 = psraw(auVar22,0xf);
  auVar42 = pmulhuw(auVar29,auVar24);
  sVar35 = auVar29._6_2_ * auVar24._6_2_;
  auVar23 = pmulhuw(auVar38,auVar32);
  sVar40 = auVar38._6_2_ * auVar32._6_2_;
  iVar11 = CONCAT22(auVar42._6_2_,sVar35);
  Var9 = CONCAT64(CONCAT42(iVar11,auVar42._4_2_),CONCAT22(auVar29._4_2_ * auVar24._4_2_,sVar35));
  auVar7._4_8_ = (long)((unkuint10)Var9 >> 0x10);
  auVar7._2_2_ = auVar42._2_2_;
  auVar7._0_2_ = auVar29._2_2_ * auVar24._2_2_;
  iVar27 = CONCAT22(auVar42._8_2_,auVar29._8_2_ * auVar24._8_2_);
  auVar28._0_8_ = CONCAT26(auVar42._10_2_,CONCAT24(auVar29._10_2_ * auVar24._10_2_,iVar27));
  auVar28._8_2_ = auVar29._12_2_ * auVar24._12_2_;
  auVar28._10_2_ = auVar42._12_2_;
  auVar30._12_2_ = auVar29._14_2_ * auVar24._14_2_;
  auVar30._0_12_ = auVar28;
  auVar30._14_2_ = auVar42._14_2_;
  iVar12 = CONCAT22(auVar23._6_2_,sVar40);
  Var10 = CONCAT64(CONCAT42(iVar12,auVar23._4_2_),CONCAT22(auVar38._4_2_ * auVar32._4_2_,sVar40));
  auVar8._4_8_ = (long)((unkuint10)Var10 >> 0x10);
  auVar8._2_2_ = auVar23._2_2_;
  auVar8._0_2_ = auVar38._2_2_ * auVar32._2_2_;
  iVar36 = CONCAT22(auVar23._8_2_,auVar38._8_2_ * auVar32._8_2_);
  auVar37._0_8_ = CONCAT26(auVar23._10_2_,CONCAT24(auVar38._10_2_ * auVar32._10_2_,iVar36));
  auVar37._8_2_ = auVar38._12_2_ * auVar32._12_2_;
  auVar37._10_2_ = auVar23._12_2_;
  auVar39._12_2_ = auVar38._14_2_ * auVar32._14_2_;
  auVar39._0_12_ = auVar37;
  auVar39._14_2_ = auVar23._14_2_;
  auVar42._0_4_ =
       (int)(mtx->bias_[0] + CONCAT22(auVar42._0_2_,auVar29._0_2_ * auVar24._0_2_)) >> 0x11;
  auVar42._4_4_ = (int)(mtx->bias_[1] + auVar7._0_4_) >> 0x11;
  auVar42._8_4_ = (int)(mtx->bias_[2] + (int)((unkuint10)Var9 >> 0x10)) >> 0x11;
  auVar42._12_4_ = (int)(mtx->bias_[3] + iVar11) >> 0x11;
  auVar41._0_4_ = (int)(mtx->bias_[4] + iVar27) >> 0x11;
  auVar41._4_4_ = (int)(mtx->bias_[5] + (int)((ulong)auVar28._0_8_ >> 0x20)) >> 0x11;
  auVar41._8_4_ = (int)(mtx->bias_[6] + auVar28._8_4_) >> 0x11;
  auVar41._12_4_ = (int)(mtx->bias_[7] + auVar30._12_4_) >> 0x11;
  auVar24 = packssdw(auVar42,auVar41);
  auVar31._0_4_ =
       (int)(mtx->bias_[8] + CONCAT22(auVar23._0_2_,auVar38._0_2_ * auVar32._0_2_)) >> 0x11;
  auVar31._4_4_ = (int)(mtx->bias_[9] + auVar8._0_4_) >> 0x11;
  auVar31._8_4_ = (int)(mtx->bias_[10] + (int)((unkuint10)Var10 >> 0x10)) >> 0x11;
  auVar31._12_4_ = (int)(mtx->bias_[0xb] + iVar12) >> 0x11;
  auVar43._0_4_ = (int)(mtx->bias_[0xc] + iVar36) >> 0x11;
  auVar43._4_4_ = (int)(mtx->bias_[0xd] + (int)((ulong)auVar37._0_8_ >> 0x20)) >> 0x11;
  auVar43._8_4_ = (int)(mtx->bias_[0xe] + auVar37._8_4_) >> 0x11;
  auVar43._12_4_ = (int)(mtx->bias_[0xf] + auVar39._12_4_) >> 0x11;
  auVar32 = packssdw(auVar31,auVar43);
  sVar35 = auVar24._0_2_;
  auVar25._0_2_ = (ushort)(0x7ff < sVar35) * 0x7ff | (ushort)(0x7ff >= sVar35) * sVar35;
  sVar35 = auVar24._2_2_;
  auVar25._2_2_ = (ushort)(0x7ff < sVar35) * 0x7ff | (ushort)(0x7ff >= sVar35) * sVar35;
  sVar35 = auVar24._4_2_;
  auVar25._4_2_ = (ushort)(0x7ff < sVar35) * 0x7ff | (ushort)(0x7ff >= sVar35) * sVar35;
  sVar35 = auVar24._6_2_;
  auVar25._6_2_ = (ushort)(0x7ff < sVar35) * 0x7ff | (ushort)(0x7ff >= sVar35) * sVar35;
  sVar35 = auVar24._8_2_;
  auVar25._8_2_ = (ushort)(0x7ff < sVar35) * 0x7ff | (ushort)(0x7ff >= sVar35) * sVar35;
  sVar35 = auVar24._10_2_;
  auVar25._10_2_ = (ushort)(0x7ff < sVar35) * 0x7ff | (ushort)(0x7ff >= sVar35) * sVar35;
  sVar35 = auVar24._12_2_;
  sVar40 = auVar24._14_2_;
  auVar25._12_2_ = (ushort)(0x7ff < sVar35) * 0x7ff | (ushort)(0x7ff >= sVar35) * sVar35;
  auVar25._14_2_ = (ushort)(0x7ff < sVar40) * 0x7ff | (ushort)(0x7ff >= sVar40) * sVar40;
  sVar35 = auVar32._0_2_;
  auVar33._0_2_ = (ushort)(0x7ff < sVar35) * 0x7ff | (ushort)(0x7ff >= sVar35) * sVar35;
  sVar35 = auVar32._2_2_;
  auVar33._2_2_ = (ushort)(0x7ff < sVar35) * 0x7ff | (ushort)(0x7ff >= sVar35) * sVar35;
  sVar35 = auVar32._4_2_;
  auVar33._4_2_ = (ushort)(0x7ff < sVar35) * 0x7ff | (ushort)(0x7ff >= sVar35) * sVar35;
  sVar35 = auVar32._6_2_;
  auVar33._6_2_ = (ushort)(0x7ff < sVar35) * 0x7ff | (ushort)(0x7ff >= sVar35) * sVar35;
  sVar35 = auVar32._8_2_;
  auVar33._8_2_ = (ushort)(0x7ff < sVar35) * 0x7ff | (ushort)(0x7ff >= sVar35) * sVar35;
  sVar35 = auVar32._10_2_;
  auVar33._10_2_ = (ushort)(0x7ff < sVar35) * 0x7ff | (ushort)(0x7ff >= sVar35) * sVar35;
  sVar35 = auVar32._12_2_;
  sVar40 = auVar32._14_2_;
  auVar33._12_2_ = (ushort)(0x7ff < sVar35) * 0x7ff | (ushort)(0x7ff >= sVar35) * sVar35;
  auVar33._14_2_ = (ushort)(0x7ff < sVar40) * 0x7ff | (ushort)(0x7ff >= sVar40) * sVar40;
  auVar25 = auVar25 ^ auVar14;
  auVar33 = auVar33 ^ auVar22;
  auVar26._0_2_ = auVar25._0_2_ - auVar14._0_2_;
  auVar26._2_2_ = auVar25._2_2_ - auVar14._2_2_;
  auVar26._4_2_ = auVar25._4_2_ - auVar14._4_2_;
  auVar26._6_2_ = auVar25._6_2_ - auVar14._6_2_;
  auVar26._8_2_ = auVar25._8_2_ - auVar14._8_2_;
  auVar26._10_2_ = auVar25._10_2_ - auVar14._10_2_;
  auVar26._12_2_ = auVar25._12_2_ - auVar14._12_2_;
  auVar26._14_2_ = auVar25._14_2_ - auVar14._14_2_;
  auVar34._0_2_ = auVar33._0_2_ - auVar22._0_2_;
  auVar34._2_2_ = auVar33._2_2_ - auVar22._2_2_;
  auVar34._4_2_ = auVar33._4_2_ - auVar22._4_2_;
  auVar34._6_2_ = auVar33._6_2_ - auVar22._6_2_;
  auVar34._8_2_ = auVar33._8_2_ - auVar22._8_2_;
  auVar34._10_2_ = auVar33._10_2_ - auVar22._10_2_;
  auVar34._12_2_ = auVar33._12_2_ - auVar22._12_2_;
  auVar34._14_2_ = auVar33._14_2_ - auVar22._14_2_;
  auVar14._0_2_ = mtx->q_[0] * auVar26._0_2_;
  auVar14._2_2_ = mtx->q_[1] * auVar26._2_2_;
  auVar14._4_2_ = mtx->q_[2] * auVar26._4_2_;
  auVar14._6_2_ = mtx->q_[3] * auVar26._6_2_;
  auVar14._8_2_ = mtx->q_[4] * auVar26._8_2_;
  auVar14._10_2_ = mtx->q_[5] * auVar26._10_2_;
  auVar14._12_2_ = mtx->q_[6] * auVar26._12_2_;
  auVar14._14_2_ = mtx->q_[7] * auVar26._14_2_;
  auVar32._0_2_ = mtx->q_[8] * auVar34._0_2_;
  auVar32._2_2_ = mtx->q_[9] * auVar34._2_2_;
  auVar32._4_2_ = mtx->q_[10] * auVar34._4_2_;
  auVar32._6_2_ = mtx->q_[0xb] * auVar34._6_2_;
  auVar32._8_2_ = mtx->q_[0xc] * auVar34._8_2_;
  auVar32._10_2_ = mtx->q_[0xd] * auVar34._10_2_;
  auVar32._12_2_ = mtx->q_[0xe] * auVar34._12_2_;
  auVar32._14_2_ = mtx->q_[0xf] * auVar34._14_2_;
  *(undefined1 (*) [16])in = auVar14;
  *(undefined1 (*) [16])(in + 8) = auVar32;
  auVar14 = pshufhw(auVar14,auVar26,0xc6);
  auVar22._0_4_ = auVar14._0_4_;
  auVar22._8_4_ = auVar14._8_4_;
  auVar22._4_4_ = auVar14._12_4_;
  auVar22._12_4_ = auVar14._4_4_;
  auVar14 = pshufhw(auVar22,auVar22,0x39);
  auVar22 = pshuflw(auVar32,auVar34,0xc6);
  auVar23._0_4_ = auVar22._0_4_;
  auVar23._12_4_ = auVar22._12_4_;
  auVar23._4_4_ = auVar22._8_4_;
  auVar23._8_4_ = auVar22._4_4_;
  auVar22 = pshuflw(auVar23,auVar23,0x39);
  *(undefined1 (*) [16])out = auVar14;
  *(undefined1 (*) [16])(out + 8) = auVar22;
  auVar14 = packsswb(auVar14,auVar22);
  out[3] = auVar34._0_2_;
  out[0xc] = auVar26._14_2_;
  auVar24[0] = -(auVar14[0] == '\0');
  auVar24[1] = -(auVar14[1] == '\0');
  auVar24[2] = -(auVar14[2] == '\0');
  auVar24[3] = -(auVar14[3] == '\0');
  auVar24[4] = -(auVar14[4] == '\0');
  auVar24[5] = -(auVar14[5] == '\0');
  auVar24[6] = -(auVar14[6] == '\0');
  auVar24[7] = -(auVar14[7] == '\0');
  auVar24[8] = -(auVar14[8] == '\0');
  auVar24[9] = -(auVar14[9] == '\0');
  auVar24[10] = -(auVar14[10] == '\0');
  auVar24[0xb] = -(auVar14[0xb] == '\0');
  auVar24[0xc] = -(auVar14[0xc] == '\0');
  auVar24[0xd] = -(auVar14[0xd] == '\0');
  auVar24[0xe] = -(auVar14[0xe] == '\0');
  auVar24[0xf] = -(auVar14[0xf] == '\0');
  return (uint)((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar24[0xf] >> 7) << 0xf) != 0xffff);
}

Assistant:

static WEBP_INLINE int DoQuantizeBlock_SSE2(
    int16_t in[16], int16_t out[16],
    const uint16_t* WEBP_RESTRICT const sharpen,
    const VP8Matrix* WEBP_RESTRICT const mtx) {
  const __m128i max_coeff_2047 = _mm_set1_epi16(MAX_LEVEL);
  const __m128i zero = _mm_setzero_si128();
  __m128i coeff0, coeff8;
  __m128i out0, out8;
  __m128i packed_out;

  // Load all inputs.
  __m128i in0 = _mm_loadu_si128((__m128i*)&in[0]);
  __m128i in8 = _mm_loadu_si128((__m128i*)&in[8]);
  const __m128i iq0 = _mm_loadu_si128((const __m128i*)&mtx->iq_[0]);
  const __m128i iq8 = _mm_loadu_si128((const __m128i*)&mtx->iq_[8]);
  const __m128i q0 = _mm_loadu_si128((const __m128i*)&mtx->q_[0]);
  const __m128i q8 = _mm_loadu_si128((const __m128i*)&mtx->q_[8]);

  // extract sign(in)  (0x0000 if positive, 0xffff if negative)
  const __m128i sign0 = _mm_cmpgt_epi16(zero, in0);
  const __m128i sign8 = _mm_cmpgt_epi16(zero, in8);

  // coeff = abs(in) = (in ^ sign) - sign
  coeff0 = _mm_xor_si128(in0, sign0);
  coeff8 = _mm_xor_si128(in8, sign8);
  coeff0 = _mm_sub_epi16(coeff0, sign0);
  coeff8 = _mm_sub_epi16(coeff8, sign8);

  // coeff = abs(in) + sharpen
  if (sharpen != NULL) {
    const __m128i sharpen0 = _mm_loadu_si128((const __m128i*)&sharpen[0]);
    const __m128i sharpen8 = _mm_loadu_si128((const __m128i*)&sharpen[8]);
    coeff0 = _mm_add_epi16(coeff0, sharpen0);
    coeff8 = _mm_add_epi16(coeff8, sharpen8);
  }

  // out = (coeff * iQ + B) >> QFIX
  {
    // doing calculations with 32b precision (QFIX=17)
    // out = (coeff * iQ)
    const __m128i coeff_iQ0H = _mm_mulhi_epu16(coeff0, iq0);
    const __m128i coeff_iQ0L = _mm_mullo_epi16(coeff0, iq0);
    const __m128i coeff_iQ8H = _mm_mulhi_epu16(coeff8, iq8);
    const __m128i coeff_iQ8L = _mm_mullo_epi16(coeff8, iq8);
    __m128i out_00 = _mm_unpacklo_epi16(coeff_iQ0L, coeff_iQ0H);
    __m128i out_04 = _mm_unpackhi_epi16(coeff_iQ0L, coeff_iQ0H);
    __m128i out_08 = _mm_unpacklo_epi16(coeff_iQ8L, coeff_iQ8H);
    __m128i out_12 = _mm_unpackhi_epi16(coeff_iQ8L, coeff_iQ8H);
    // out = (coeff * iQ + B)
    const __m128i bias_00 = _mm_loadu_si128((const __m128i*)&mtx->bias_[0]);
    const __m128i bias_04 = _mm_loadu_si128((const __m128i*)&mtx->bias_[4]);
    const __m128i bias_08 = _mm_loadu_si128((const __m128i*)&mtx->bias_[8]);
    const __m128i bias_12 = _mm_loadu_si128((const __m128i*)&mtx->bias_[12]);
    out_00 = _mm_add_epi32(out_00, bias_00);
    out_04 = _mm_add_epi32(out_04, bias_04);
    out_08 = _mm_add_epi32(out_08, bias_08);
    out_12 = _mm_add_epi32(out_12, bias_12);
    // out = QUANTDIV(coeff, iQ, B, QFIX)
    out_00 = _mm_srai_epi32(out_00, QFIX);
    out_04 = _mm_srai_epi32(out_04, QFIX);
    out_08 = _mm_srai_epi32(out_08, QFIX);
    out_12 = _mm_srai_epi32(out_12, QFIX);

    // pack result as 16b
    out0 = _mm_packs_epi32(out_00, out_04);
    out8 = _mm_packs_epi32(out_08, out_12);

    // if (coeff > 2047) coeff = 2047
    out0 = _mm_min_epi16(out0, max_coeff_2047);
    out8 = _mm_min_epi16(out8, max_coeff_2047);
  }

  // get sign back (if (sign[j]) out_n = -out_n)
  out0 = _mm_xor_si128(out0, sign0);
  out8 = _mm_xor_si128(out8, sign8);
  out0 = _mm_sub_epi16(out0, sign0);
  out8 = _mm_sub_epi16(out8, sign8);

  // in = out * Q
  in0 = _mm_mullo_epi16(out0, q0);
  in8 = _mm_mullo_epi16(out8, q8);

  _mm_storeu_si128((__m128i*)&in[0], in0);
  _mm_storeu_si128((__m128i*)&in[8], in8);

  // zigzag the output before storing it.
  //
  // The zigzag pattern can almost be reproduced with a small sequence of
  // shuffles. After it, we only need to swap the 7th (ending up in third
  // position instead of twelfth) and 8th values.
  {
    __m128i outZ0, outZ8;
    outZ0 = _mm_shufflehi_epi16(out0,  _MM_SHUFFLE(2, 1, 3, 0));
    outZ0 = _mm_shuffle_epi32  (outZ0, _MM_SHUFFLE(3, 1, 2, 0));
    outZ0 = _mm_shufflehi_epi16(outZ0, _MM_SHUFFLE(3, 1, 0, 2));
    outZ8 = _mm_shufflelo_epi16(out8,  _MM_SHUFFLE(3, 0, 2, 1));
    outZ8 = _mm_shuffle_epi32  (outZ8, _MM_SHUFFLE(3, 1, 2, 0));
    outZ8 = _mm_shufflelo_epi16(outZ8, _MM_SHUFFLE(1, 3, 2, 0));
    _mm_storeu_si128((__m128i*)&out[0], outZ0);
    _mm_storeu_si128((__m128i*)&out[8], outZ8);
    packed_out = _mm_packs_epi16(outZ0, outZ8);
  }
  {
    const int16_t outZ_12 = out[12];
    const int16_t outZ_3 = out[3];
    out[3] = outZ_12;
    out[12] = outZ_3;
  }

  // detect if all 'out' values are zeroes or not
  return (_mm_movemask_epi8(_mm_cmpeq_epi8(packed_out, zero)) != 0xffff);
}